

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O1

void UnityAssertFloatSpecial(_UF actual,char *msg,_U_UINT lineNumber,UNITY_FLOAT_TRAIT_T style)

{
  char *string;
  UNITY_FLOAT_TRAIT_T UVar1;
  uint uVar2;
  uint uVar3;
  UNITY_FLOAT_TRAIT_T UVar4;
  bool bVar5;
  char *trait_names [4];
  char *local_38 [4];
  
  local_38[2] = "NaN";
  local_38[3] = "Determinate";
  local_38[0] = "Infinity";
  local_38[1] = "Negative Infinity";
  if (Unity.CurrentTestIgnored != 0 || Unity.CurrentTestFailed != 0) {
    return;
  }
  UVar4 = style & UNITY_FLOAT_IS_INF;
  if (UNITY_FLOAT_IS_DET < style) {
    UVar1 = UVar4 ^ UNITY_FLOAT_IS_INF;
    local_38[0] = "Invalid Float Trait";
    uVar2 = 0;
    goto LAB_00103481;
  }
  uVar2 = style >> 1;
  switch(style) {
  default:
    bVar5 = actual < INFINITY;
    break;
  case UNITY_FLOAT_IS_NOT_NEG_INF:
  case UNITY_FLOAT_IS_NEG_INF:
    bVar5 = -INFINITY < actual;
    break;
  case UNITY_FLOAT_IS_NOT_NAN:
  case UNITY_FLOAT_IS_NAN:
    UVar1 = (UNITY_FLOAT_TRAIT_T)NAN(actual);
    goto LAB_00103481;
  case UNITY_FLOAT_IS_NOT_DET:
  case UNITY_FLOAT_IS_DET:
    uVar3 = 0;
    if (ABS(actual) == INFINITY) {
      uVar3 = (int)actual >> 0x1f | 1;
    }
    UVar1 = (UNITY_FLOAT_TRAIT_T)(!NAN(actual) && uVar3 == 0);
    goto LAB_00103481;
  }
  UVar1 = (UNITY_FLOAT_TRAIT_T)!bVar5;
LAB_00103481:
  if (UVar1 == UVar4) {
    return;
  }
  UnityTestResultsFailBegin(lineNumber);
  UnityPrint(" Expected ");
  if (UVar4 == UNITY_FLOAT_IS_NOT_INF) {
    UnityPrint("Not ");
  }
  string = local_38[uVar2];
  UnityPrint(string);
  UnityPrint(" Was ");
  if (UVar4 != UNITY_FLOAT_IS_NOT_INF) {
    UnityPrint("Not ");
  }
  UnityPrint(string);
  UnityAddMsgIfSpecified(msg);
  Unity.CurrentTestFailed = 1;
  longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
}

Assistant:

void UnityAssertFloatSpecial(const _UF actual,
                             const char* msg,
                             const UNITY_LINE_TYPE lineNumber,
                             const UNITY_FLOAT_TRAIT_T style)
{
    const char* trait_names[] = { UnityStrInf, UnityStrNegInf, UnityStrNaN, UnityStrDet };
    _U_SINT should_be_trait   = ((_U_SINT)style & 1);
    _U_SINT is_trait          = !should_be_trait;
    _U_SINT trait_index       = (_U_SINT)(style >> 1);

    UNITY_SKIP_EXECUTION;

    switch(style)
    {
        case UNITY_FLOAT_IS_INF:
        case UNITY_FLOAT_IS_NOT_INF:
            is_trait = isinf(actual) & ispos(actual);
            break;
        case UNITY_FLOAT_IS_NEG_INF:
        case UNITY_FLOAT_IS_NOT_NEG_INF:
            is_trait = isinf(actual) & isneg(actual);
            break;

        case UNITY_FLOAT_IS_NAN:
        case UNITY_FLOAT_IS_NOT_NAN:
            is_trait = isnan(actual);
            break;

        /* A determinate number is non infinite and not NaN. (therefore the opposite of the two above) */
        case UNITY_FLOAT_IS_DET:
        case UNITY_FLOAT_IS_NOT_DET:
            if (isinf(actual) | isnan(actual))
                is_trait = 0;
            else
                is_trait = 1;
            break;

        default:
            trait_index = 0;
            trait_names[0] = UnityStrInvalidFloatTrait;
            break;
    }

    if (is_trait != should_be_trait)
    {
        UnityTestResultsFailBegin(lineNumber);
        UnityPrint(UnityStrExpected);
        if (!should_be_trait)
            UnityPrint(UnityStrNot);
        UnityPrint(trait_names[trait_index]);
        UnityPrint(UnityStrWas);
#ifdef UNITY_FLOAT_VERBOSE
        UnityPrintFloat(actual);
#else
        if (should_be_trait)
            UnityPrint(UnityStrNot);
        UnityPrint(trait_names[trait_index]);
#endif
        UnityAddMsgIfSpecified(msg);
        UNITY_FAIL_AND_BAIL;
    }
}